

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

LibraryMapSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LibraryMapSyntax,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::MemberSyntax> *args,Token *args_1)

{
  size_t sVar1;
  pointer ppMVar2;
  Info *pIVar3;
  SyntaxNode *pSVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  LibraryMapSyntax *pLVar10;
  long lVar11;
  
  pLVar10 = (LibraryMapSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((LibraryMapSyntax *)this->endPtr < pLVar10 + 1) {
    pLVar10 = (LibraryMapSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pLVar10 + 1);
  }
  TVar6 = args_1->kind;
  uVar7 = args_1->field_0x2;
  NVar8.raw = (args_1->numFlags).raw;
  uVar9 = args_1->rawLen;
  pIVar3 = args_1->info;
  (pLVar10->super_SyntaxNode).kind = LibraryMap;
  (pLVar10->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pLVar10->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  uVar5 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pLVar10->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pLVar10->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pLVar10->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (pLVar10->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pLVar10->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00cb68b8;
  (pLVar10->members).super_SyntaxListBase.childCount = (args->super_SyntaxListBase).childCount;
  sVar1 = (args->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (pLVar10->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pLVar10->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (pLVar10->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00cbe9e8;
  (pLVar10->endOfFile).kind = TVar6;
  (pLVar10->endOfFile).field_0x2 = uVar7;
  (pLVar10->endOfFile).numFlags = (NumericTokenFlags)NVar8.raw;
  (pLVar10->endOfFile).rawLen = uVar9;
  (pLVar10->endOfFile).info = pIVar3;
  (pLVar10->members).super_SyntaxListBase.super_SyntaxNode.parent = &pLVar10->super_SyntaxNode;
  sVar1 = (pLVar10->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppMVar2 = (pLVar10->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar11 = 0;
    do {
      *(LibraryMapSyntax **)(*(long *)((long)ppMVar2 + lVar11) + 8) = pLVar10;
      lVar11 = lVar11 + 8;
    } while (sVar1 << 3 != lVar11);
  }
  return pLVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }